

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void ITransform_One_SSE2(uint8_t *ref,int16_t *in,uint8_t *dst)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined6 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined6 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined4 uVar20;
  undefined6 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined4 uVar24;
  undefined6 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  undefined8 *in_RSI;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  __m128i ref3;
  __m128i ref2;
  __m128i ref1;
  __m128i ref0;
  int32_t buf [4];
  __m128i ref0123;
  __m128i ref23;
  __m128i ref01;
  __m128i transpose_1_1;
  __m128i transpose_0_1;
  __m128i shifted23;
  __m128i shifted01;
  __m128i tmp23_1;
  __m128i tmp32_1;
  __m128i tmp01_1;
  __m128i comb_dc_1;
  __m128i comb_ab_1;
  __m128i d_1;
  __m128i du_1;
  __m128i d4u_1;
  __m128i c_1;
  __m128i c4_1;
  __m128i c3_1;
  __m128i c2d2_1;
  __m128i c1d1_1;
  __m128i b_c3_1;
  __m128i a_d3_1;
  __m128i dc;
  __m128i T3;
  __m128i T1;
  __m128i transpose_1;
  __m128i transpose_0;
  __m128i tmp23;
  __m128i tmp32;
  __m128i tmp01;
  __m128i comb_dc;
  __m128i comb_ab;
  __m128i d;
  __m128i du;
  __m128i d4u;
  __m128i c;
  __m128i c4;
  __m128i c3;
  __m128i c2d2;
  __m128i c1d1;
  __m128i b_c3;
  __m128i a_d3;
  __m128i in3;
  __m128i in1;
  __m128i in23;
  __m128i in01;
  __m128i T23;
  __m128i T01;
  __m128i zero_four;
  __m128i zero;
  __m128i k2k1;
  __m128i k1k2;
  ulong uVar63;
  int val;
  uint8_t *ptr;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  char local_ac8;
  char cStack_ac7;
  char cStack_ac6;
  char cStack_ac5;
  char cStack_ac4;
  char cStack_ac3;
  char cStack_ac2;
  char cStack_ac1;
  char cStack_ac0;
  char cStack_abf;
  char cStack_abe;
  char cStack_abd;
  char cStack_abc;
  char cStack_abb;
  char cStack_aba;
  char cStack_ab9;
  short local_ab8;
  undefined2 uStack_ab6;
  undefined2 uStack_ab4;
  undefined2 uStack_ab2;
  short sStack_ab0;
  undefined2 uStack_aae;
  undefined2 uStack_aac;
  undefined2 uStack_aaa;
  short local_aa8;
  undefined2 uStack_aa6;
  undefined2 uStack_aa4;
  undefined2 uStack_aa2;
  short sStack_aa0;
  undefined2 uStack_a9e;
  undefined2 uStack_a9c;
  undefined2 uStack_a9a;
  short local_a98;
  short sStack_a96;
  short sStack_a94;
  short sStack_a92;
  short sStack_a90;
  short sStack_a8e;
  short sStack_a8c;
  short sStack_a8a;
  short local_a88;
  short sStack_a86;
  short sStack_a84;
  short sStack_a82;
  short sStack_a80;
  short sStack_a7e;
  short sStack_a7c;
  short sStack_a7a;
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  short local_a48;
  short sStack_a46;
  short sStack_a44;
  short sStack_a42;
  short sStack_a40;
  short sStack_a3e;
  short sStack_a3c;
  short sStack_a3a;
  short local_a38;
  short sStack_a36;
  short sStack_a34;
  short sStack_a32;
  short sStack_a30;
  short sStack_a2e;
  short sStack_a2c;
  short sStack_a2a;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  short local_9f8;
  short sStack_9f6;
  short sStack_9f4;
  short sStack_9f2;
  short sStack_9f0;
  short sStack_9ee;
  undefined4 uStack_9ec;
  short local_9e8;
  short sStack_9e6;
  short sStack_9e4;
  short sStack_9e2;
  short sStack_9e0;
  short sStack_9de;
  short sStack_9dc;
  short sStack_9da;
  short local_9d8;
  short sStack_9d6;
  short sStack_9d4;
  short sStack_9d2;
  short sStack_9d0;
  short sStack_9ce;
  short sStack_9cc;
  short sStack_9ca;
  short local_9c8;
  short sStack_9c6;
  short sStack_9c4;
  short sStack_9c2;
  short sStack_9c0;
  short sStack_9be;
  short sStack_9bc;
  short sStack_9ba;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  short local_988;
  short sStack_986;
  short sStack_984;
  short sStack_982;
  short sStack_980;
  short sStack_97e;
  short sStack_97c;
  short sStack_97a;
  short local_978;
  short sStack_976;
  short sStack_974;
  short sStack_972;
  short sStack_970;
  short sStack_96e;
  short sStack_96c;
  short sStack_96a;
  short local_968;
  short sStack_966;
  short sStack_964;
  short sStack_962;
  short sStack_960;
  short sStack_95e;
  short sStack_95c;
  short sStack_95a;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  short local_938;
  short sStack_936;
  short sStack_934;
  short sStack_932;
  short sStack_930;
  short sStack_92e;
  short sStack_92c;
  short sStack_92a;
  short local_928;
  short sStack_926;
  short sStack_924;
  short sStack_922;
  short sStack_920;
  short sStack_91e;
  short sStack_91c;
  short sStack_91a;
  undefined1 local_918 [16];
  short local_908;
  short sStack_906;
  short sStack_904;
  short sStack_902;
  short sStack_900;
  short sStack_8fe;
  short sStack_8fc;
  short sStack_8fa;
  short local_8f8;
  short sStack_8f6;
  short sStack_8f4;
  short sStack_8f2;
  short sStack_8f0;
  short sStack_8ee;
  short sStack_8ec;
  short sStack_8ea;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  short local_8b8;
  short sStack_8b6;
  short sStack_8b4;
  short sStack_8b2;
  short sStack_8b0;
  short sStack_8ae;
  undefined4 uStack_8ac;
  short local_8a8;
  short sStack_8a6;
  short sStack_8a4;
  short sStack_8a2;
  short sStack_8a0;
  short sStack_89e;
  short sStack_89c;
  short sStack_89a;
  short local_898;
  short sStack_896;
  short sStack_894;
  short sStack_892;
  short sStack_890;
  short sStack_88e;
  short sStack_88c;
  short sStack_88a;
  short local_888;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_880;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined1 local_868 [16];
  undefined1 local_858 [16];
  short local_848;
  short sStack_846;
  short sStack_844;
  short sStack_842;
  short sStack_840;
  short sStack_83e;
  short sStack_83c;
  short sStack_83a;
  short local_838;
  short sStack_836;
  short sStack_834;
  short sStack_832;
  short sStack_830;
  short sStack_82e;
  short sStack_82c;
  short sStack_82a;
  undefined8 local_828;
  undefined4 uStack_81c;
  undefined4 uStack_814;
  undefined4 uStack_80c;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  short local_7e8;
  short sStack_7e6;
  short sStack_7e4;
  short sStack_7e2;
  short sStack_7e0;
  short sStack_7de;
  short sStack_7dc;
  short sStack_7da;
  short local_7d8;
  short sStack_7d6;
  short sStack_7d4;
  short sStack_7d2;
  short sStack_7d0;
  short sStack_7ce;
  short sStack_7cc;
  short sStack_7ca;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 *local_758;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined4 local_67c;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined4 local_65c;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 *local_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined2 local_618;
  undefined2 local_616;
  undefined2 local_614;
  undefined2 local_612;
  undefined2 local_610;
  undefined2 local_60e;
  undefined2 local_60c;
  undefined2 local_60a;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined2 local_5f8;
  undefined2 local_5f6;
  undefined2 local_5f4;
  undefined2 local_5f2;
  undefined2 local_5f0;
  undefined2 local_5ee;
  undefined2 local_5ec;
  undefined2 local_5ea;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined2 local_5d8;
  undefined2 local_5d6;
  undefined2 local_5d4;
  undefined2 local_5d2;
  undefined2 local_5d0;
  undefined2 local_5ce;
  undefined2 local_5cc;
  undefined2 local_5ca;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  short local_528;
  short sStack_526;
  short sStack_524;
  short sStack_522;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  short local_4b8;
  short sStack_4b6;
  short sStack_4b4;
  short sStack_4b2;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  short local_468;
  short sStack_466;
  short sStack_464;
  short sStack_462;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  short local_3f8;
  short sStack_3f6;
  short sStack_3f4;
  short sStack_3f2;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined1 local_348 [28];
  uint local_32c;
  undefined1 local_328 [16];
  uint local_30c;
  undefined1 local_308 [16];
  uint local_2ec;
  undefined1 local_2e8 [16];
  uint local_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1ac;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_18c;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined8 local_e8;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined8 uStack_c0;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  undefined8 uStack_40;
  ulong local_38;
  undefined8 uStack_30;
  ulong local_28;
  undefined8 uStack_20;
  ulong local_18;
  undefined8 uStack_10;
  
  local_5ca = 0x8a8c;
  local_5cc = 0x8a8c;
  local_5ce = 0x8a8c;
  local_5d0 = 0x8a8c;
  local_5d2 = 0x4e7b;
  local_5d4 = 0x4e7b;
  local_5d6 = 0x4e7b;
  local_5d8 = 0x4e7b;
  local_c8 = 0x4e7b4e7b;
  local_798 = 0x4e7b4e7b4e7b4e7b;
  uStack_790 = 0x8a8c8a8c8a8c8a8c;
  local_5ea = 0x4e7b;
  local_5ec = 0x4e7b;
  local_5ee = 0x4e7b;
  local_5f0 = 0x4e7b;
  local_5f2 = 0x8a8c;
  local_5f4 = 0x8a8c;
  local_5f6 = 0x8a8c;
  local_5f8 = 0x8a8c;
  local_7a8 = 0x8a8c8a8c8a8c8a8c;
  uStack_7a0 = 0x4e7b4e7b4e7b4e7b;
  local_768 = 0;
  uStack_760 = 0;
  local_7b8 = 0;
  uStack_7b0 = 0;
  local_60a = 0;
  local_60c = 0;
  local_60e = 0;
  local_610 = 0;
  local_612 = 4;
  local_614 = 4;
  local_616 = 4;
  local_618 = 4;
  local_7c8 = 0x4000400040004;
  uStack_7c0 = 0;
  local_7f8 = *in_RSI;
  uStack_690 = in_RSI[1];
  local_758 = in_RSI + 2;
  uVar8 = *local_758;
  uStack_6a0 = in_RSI[3];
  uStack_7f0._4_4_ = (undefined4)((ulong)uStack_690 >> 0x20);
  uStack_cc = uStack_7f0._4_4_;
  uStack_dc = uStack_7f0._4_4_;
  _local_d8 = CONCAT44((int)((ulong)local_7f8 >> 0x20),CONCAT22(sStack_7e6,local_7e8));
  uStack_80c = uStack_7f0._4_4_;
  local_808._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
  local_808 = CONCAT44(local_808._4_4_,CONCAT22(sStack_7e6,local_7e8));
  uStack_800._4_4_ = (undefined4)((ulong)uStack_6a0 >> 0x20);
  uStack_ec = uStack_800._4_4_;
  uStack_fc = uStack_800._4_4_;
  _local_f8 = CONCAT44(local_808._4_4_,(undefined4)local_7f8);
  uStack_81c = uStack_800._4_4_;
  uStack_814 = uStack_800._4_4_;
  local_3e8 = local_808;
  uVar23 = local_3e8;
  local_3d8._0_2_ = (short)local_7f8;
  local_3d8._2_2_ = (short)((ulong)local_7f8 >> 0x10);
  local_3d8._4_2_ = (short)((ulong)local_7f8 >> 0x20);
  local_3d8._6_2_ = (short)((ulong)local_7f8 >> 0x30);
  uStack_3d0._0_2_ = (short)uStack_690;
  uStack_3d0._2_2_ = (short)((ulong)uStack_690 >> 0x10);
  uStack_3d0._4_2_ = (short)((ulong)uStack_690 >> 0x20);
  uStack_3d0._6_2_ = (short)((ulong)uStack_690 >> 0x30);
  local_3e8._4_2_ = (short)((ulong)uVar8 >> 0x20);
  local_3e8._6_2_ = (short)((ulong)uVar8 >> 0x30);
  uStack_3e0._0_2_ = (short)uStack_6a0;
  uStack_3e0._2_2_ = (short)((ulong)uStack_6a0 >> 0x10);
  uStack_3e0._4_2_ = (short)((ulong)uStack_6a0 >> 0x20);
  uStack_3e0._6_2_ = (short)((ulong)uStack_6a0 >> 0x30);
  local_838 = (short)local_3d8 + local_7e8;
  sStack_836 = local_3d8._2_2_ + sStack_7e6;
  sStack_834 = local_3d8._4_2_ + local_3e8._4_2_;
  sStack_832 = local_3d8._6_2_ + local_3e8._6_2_;
  sStack_830 = (short)uStack_3d0 + (short)uStack_3e0;
  sStack_82e = uStack_3d0._2_2_ + uStack_3e0._2_2_;
  sStack_82c = uStack_3d0._4_2_ + uStack_3e0._4_2_;
  sStack_82a = uStack_3d0._6_2_ + uStack_3e0._6_2_;
  local_6a8 = local_808;
  local_848 = (short)local_3d8 - local_7e8;
  sStack_846 = local_3d8._2_2_ - sStack_7e6;
  sStack_844 = local_3d8._4_2_ - local_3e8._4_2_;
  sStack_842 = local_3d8._6_2_ - local_3e8._6_2_;
  sStack_840 = (short)uStack_3d0 - (short)uStack_3e0;
  sStack_83e = uStack_3d0._2_2_ - uStack_3e0._2_2_;
  sStack_83c = uStack_3d0._4_2_ - uStack_3e0._4_2_;
  sStack_83a = uStack_3d0._6_2_ - uStack_3e0._6_2_;
  local_58 = CONCAT44(uStack_800._4_4_,uStack_100);
  uStack_50 = CONCAT44(uStack_7f0._4_4_,uStack_d0);
  auVar37._8_8_ = uStack_50;
  auVar37._0_8_ = local_58;
  auVar36._8_8_ = 0x4e7b4e7b4e7b4e7b;
  auVar36._0_8_ = 0x8a8c8a8c8a8c8a8c;
  local_858 = pmulhw(auVar37,auVar36);
  uStack_70 = CONCAT44(uStack_800._4_4_,uStack_f0);
  auVar35._8_8_ = uStack_70;
  auVar35._0_8_ = local_828;
  auVar34._8_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar34._0_8_ = 0x4e7b4e7b4e7b4e7b;
  local_868 = pmulhw(auVar35,auVar34);
  uVar10 = CONCAT22(sStack_842,sStack_844);
  uStack_11c = CONCAT22(sStack_83a,sStack_83c);
  _local_108 = CONCAT44(local_808._4_4_,CONCAT22(sStack_836,local_838));
  _local_118 = CONCAT44(uVar10,CONCAT22(sStack_836,local_838));
  auVar1._4_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar1._0_4_ = uVar10;
  auVar56._0_8_ = auVar1._0_8_ << 0x20;
  auVar56._8_4_ = uStack_120;
  auVar56._12_4_ = uStack_11c;
  uStack_870 = auVar56._8_8_;
  local_6b8 = local_858._0_8_;
  uVar19 = local_6b8;
  uStack_6b0 = local_858._8_8_;
  uVar22 = uStack_6b0;
  local_6c8 = local_868._0_8_;
  uVar17 = local_6c8;
  uStack_6c0 = local_868._8_8_;
  uVar18 = uStack_6c0;
  local_6b8._0_2_ = local_858._0_2_;
  local_6b8._2_2_ = local_858._2_2_;
  local_6b8._4_2_ = local_858._4_2_;
  local_6b8._6_2_ = local_858._6_2_;
  uStack_6b0._0_2_ = local_858._8_2_;
  uStack_6b0._2_2_ = local_858._10_2_;
  uStack_6b0._4_2_ = local_858._12_2_;
  uStack_6b0._6_2_ = local_858._14_2_;
  local_6c8._0_2_ = local_868._0_2_;
  local_6c8._2_2_ = local_868._2_2_;
  local_6c8._4_2_ = local_868._4_2_;
  local_6c8._6_2_ = local_868._6_2_;
  uStack_6c0._0_2_ = local_868._8_2_;
  uStack_6c0._2_2_ = local_868._10_2_;
  uStack_6c0._4_2_ = local_868._12_2_;
  uStack_6c0._6_2_ = local_868._14_2_;
  local_888 = (short)local_6b8 - (short)local_6c8;
  sStack_886 = local_6b8._2_2_ - local_6c8._2_2_;
  sStack_884 = local_6b8._4_2_ - local_6c8._4_2_;
  sStack_882 = local_6b8._6_2_ - local_6c8._6_2_;
  sStack_880 = (short)uStack_6b0 - (short)uStack_6c0;
  sStack_87e = uStack_6b0._2_2_ - uStack_6c0._2_2_;
  sStack_87c = uStack_6b0._4_2_ - uStack_6c0._4_2_;
  sStack_87a = uStack_6b0._6_2_ - uStack_6c0._6_2_;
  local_408 = CONCAT26(sStack_882,CONCAT24(sStack_884,CONCAT22(sStack_886,local_888)));
  uStack_400 = CONCAT26(sStack_87a,CONCAT24(sStack_87c,CONCAT22(sStack_87e,sStack_880)));
  local_3f8 = (short)local_878;
  sStack_3f6 = (short)((ulong)local_878 >> 0x10);
  sStack_3f4 = (short)((ulong)local_878 >> 0x20);
  sStack_3f2 = (short)((ulong)local_878 >> 0x30);
  uStack_3f0._0_2_ = (short)uStack_120;
  uStack_3f0._2_2_ = (short)((uint)uStack_120 >> 0x10);
  local_898 = local_3f8 + local_888;
  sStack_896 = sStack_3f6 + sStack_886;
  sStack_894 = sStack_3f4 + sStack_884;
  sStack_892 = sStack_3f2 + sStack_882;
  sStack_890 = (short)uStack_3f0 + sStack_880;
  sStack_88e = uStack_3f0._2_2_ + sStack_87e;
  sStack_88c = sStack_83c + sStack_87c;
  sStack_88a = sStack_83a + sStack_87a;
  local_418 = local_858._0_8_;
  uStack_410 = local_858._8_8_;
  local_428 = local_868._0_8_;
  uStack_420 = local_868._8_8_;
  local_8a8 = (short)local_6b8 + (short)local_6c8;
  sStack_8a6 = local_6b8._2_2_ + local_6c8._2_2_;
  sStack_8a4 = local_6b8._4_2_ + local_6c8._4_2_;
  sStack_8a2 = local_6b8._6_2_ + local_6c8._6_2_;
  sStack_8a0 = (short)uStack_6b0 + (short)uStack_6c0;
  sStack_89e = uStack_6b0._2_2_ + uStack_6c0._2_2_;
  sStack_89c = uStack_6b0._4_2_ + uStack_6c0._4_2_;
  sStack_89a = uStack_6b0._6_2_ + uStack_6c0._6_2_;
  local_438 = CONCAT26(sStack_832,CONCAT24(sStack_834,CONCAT22(sStack_836,local_838)));
  uStack_430 = CONCAT26(sStack_82a,CONCAT24(sStack_82c,CONCAT22(sStack_82e,sStack_830)));
  local_448 = CONCAT26(sStack_8a2,CONCAT24(sStack_8a4,CONCAT22(sStack_8a6,local_8a8)));
  uStack_440 = CONCAT26(sStack_89a,CONCAT24(sStack_89c,CONCAT22(sStack_89e,sStack_8a0)));
  local_8b8 = local_838 + local_8a8;
  sStack_8b6 = sStack_836 + sStack_8a6;
  sStack_8b4 = sStack_834 + sStack_8a4;
  sStack_8b2 = sStack_832 + sStack_8a2;
  sStack_8b0 = sStack_830 + sStack_8a0;
  sStack_8ae = sStack_82e + sStack_89e;
  uStack_8ac = CONCAT22(sStack_82a + sStack_89a,sStack_82c + sStack_89c);
  uVar14 = CONCAT22(sStack_8b2,sStack_8b4);
  uStack_12c = uStack_8ac;
  _local_128 = CONCAT44(uVar10,CONCAT22(sStack_8a6,local_8a8));
  uStack_13c = uStack_8ac;
  _local_138 = CONCAT44(uVar14,CONCAT22(sStack_8a6,local_8a8));
  auVar2._4_8_ = uStack_440;
  auVar2._0_4_ = uVar14;
  auVar57._0_8_ = auVar2._0_8_ << 0x20;
  auVar57._8_4_ = uStack_140;
  auVar57._12_4_ = uStack_8ac;
  uStack_8c0 = auVar57._8_8_;
  local_8d8 = CONCAT26(sStack_832,CONCAT24(sStack_834,CONCAT22(sStack_836,local_838)));
  uStack_350 = CONCAT26(sStack_82a,CONCAT24(sStack_82c,CONCAT22(sStack_82e,sStack_830)));
  uStack_8d0 = CONCAT26(sStack_842,CONCAT24(sStack_844,CONCAT22(sStack_846,local_848)));
  uStack_360 = CONCAT26(sStack_83a,CONCAT24(sStack_83c,CONCAT22(sStack_83e,sStack_840)));
  uStack_8e0 = CONCAT26(sStack_892,CONCAT24(sStack_894,CONCAT22(sStack_896,local_898)));
  uStack_380 = CONCAT26(sStack_88a,CONCAT24(sStack_88c,CONCAT22(sStack_88e,sStack_890)));
  local_468 = (short)local_8c8;
  sStack_466 = (short)((ulong)local_8c8 >> 0x10);
  sStack_464 = (short)((ulong)local_8c8 >> 0x20);
  sStack_462 = (short)((ulong)local_8c8 >> 0x30);
  local_928 = local_838 + local_468;
  sStack_960 = sStack_836 + sStack_466;
  sStack_920 = sStack_834 + sStack_464;
  sStack_91c = sStack_832 + sStack_462;
  local_938 = local_848 + local_898;
  sStack_95e = sStack_846 + sStack_896;
  sStack_930 = sStack_844 + sStack_894;
  sStack_92c = sStack_842 + sStack_892;
  sStack_936 = local_838 - local_468;
  sStack_95a = sStack_836 - sStack_466;
  sStack_92e = sStack_834 - sStack_464;
  sStack_92a = sStack_832 - sStack_462;
  sStack_926 = local_848 - local_898;
  sStack_95c = sStack_846 - sStack_896;
  sStack_91e = sStack_844 - sStack_894;
  sStack_91a = sStack_842 - sStack_892;
  uVar8 = CONCAT26(sStack_92a,CONCAT24(sStack_92e,CONCAT22(sStack_95a,sStack_936)));
  auVar27._8_2_ = sStack_926;
  auVar27._0_8_ = uVar8;
  auVar27._10_2_ = sStack_95c;
  auVar27._12_2_ = sStack_91e;
  auVar27._14_2_ = sStack_91a;
  local_918._0_8_ = auVar27._8_8_;
  local_918._8_4_ = CONCAT22(sStack_95a,sStack_936);
  local_918._12_4_ = (int)((ulong)uVar8 >> 0x20);
  local_258 = CONCAT26(sStack_91c,CONCAT24(sStack_920,CONCAT22(sStack_960,local_928)));
  uStack_250 = CONCAT26(sStack_92c,CONCAT24(sStack_930,CONCAT22(sStack_95e,local_938)));
  uStack_260 = local_918._8_8_;
  local_1d8 = CONCAT26(sStack_91c,CONCAT24(sStack_920,CONCAT22(sStack_960,local_928)));
  uStack_1d0 = CONCAT26(sStack_92c,CONCAT24(sStack_930,CONCAT22(sStack_95e,local_938)));
  uStack_1e0 = local_918._8_8_;
  local_278 = CONCAT26(sStack_95c,CONCAT24(sStack_960,CONCAT22(sStack_926,local_928)));
  uStack_270 = CONCAT26(sStack_91a,CONCAT24(sStack_91c,CONCAT22(sStack_91e,sStack_920)));
  local_288 = CONCAT26(sStack_95a,CONCAT24(sStack_95e,CONCAT22(sStack_936,local_938)));
  uStack_280 = CONCAT26(sStack_92a,CONCAT24(sStack_92c,CONCAT22(sStack_92e,sStack_930)));
  local_1f8 = CONCAT26(sStack_95c,CONCAT24(sStack_960,CONCAT22(sStack_926,local_928)));
  uStack_1f0 = CONCAT26(sStack_91a,CONCAT24(sStack_91c,CONCAT22(sStack_91e,sStack_920)));
  local_208 = CONCAT26(sStack_95a,CONCAT24(sStack_95e,CONCAT22(sStack_936,local_938)));
  uStack_200 = CONCAT26(sStack_92a,CONCAT24(sStack_92c,CONCAT22(sStack_92e,sStack_930)));
  auVar3._4_8_ = uStack_1f0;
  auVar3._0_4_ = (int)((ulong)local_208 >> 0x20);
  auVar58._0_8_ = auVar3._0_8_ << 0x20;
  auVar58._8_4_ = CONCAT22(sStack_92e,sStack_930);
  auVar58._12_4_ = (undefined4)((ulong)uStack_200 >> 0x20);
  uVar10 = CONCAT22(sStack_936,sStack_926);
  uStack_15c = CONCAT22(sStack_95a,sStack_95c);
  _local_148 = CONCAT44(uVar14,0x40004);
  _local_158 = CONCAT44(uVar10,0x40004);
  auVar4._4_8_ = auVar58._8_8_;
  auVar4._0_4_ = uVar10;
  auVar59._0_8_ = auVar4._0_8_ << 0x20;
  auVar59._8_4_ = uStack_160;
  auVar59._12_4_ = uStack_15c;
  uStack_940 = auVar59._8_8_;
  uVar14 = CONCAT22(sStack_92e,sStack_91e);
  uStack_17c = CONCAT22(sStack_92a,sStack_91a);
  _local_168 = CONCAT44(uVar10,CONCAT22(local_938,local_928));
  _local_178 = CONCAT44(uVar14,CONCAT22(local_938,local_928));
  auVar5._4_8_ = uStack_940;
  auVar5._0_4_ = uVar14;
  auVar60._0_8_ = auVar5._0_8_ << 0x20;
  auVar60._8_4_ = uStack_180;
  auVar60._12_4_ = uStack_17c;
  uStack_950 = auVar60._8_8_;
  local_478 = CONCAT26(sStack_936,CONCAT24(sStack_926,CONCAT22(local_938,local_928)));
  uStack_470 = CONCAT26(sStack_95a,CONCAT24(sStack_95c,CONCAT22(sStack_95e,sStack_960)));
  local_968 = local_928 + 4;
  sStack_966 = local_938 + 4;
  sStack_964 = sStack_926 + 4;
  sStack_962 = sStack_936 + 4;
  local_498 = CONCAT26(sStack_962,CONCAT24(sStack_964,CONCAT22(sStack_966,local_968)));
  uStack_490 = CONCAT26(sStack_95a,CONCAT24(sStack_95c,CONCAT22(sStack_95e,sStack_960)));
  local_4a8 = CONCAT26(sStack_92e,CONCAT24(sStack_91e,CONCAT22(sStack_930,sStack_920)));
  uStack_4a0 = CONCAT26(sStack_92a,CONCAT24(sStack_91a,CONCAT22(sStack_92c,sStack_91c)));
  local_978 = local_968 + sStack_920;
  sStack_976 = sStack_966 + sStack_930;
  sStack_974 = sStack_964 + sStack_91e;
  sStack_972 = sStack_962 + sStack_92e;
  sStack_970 = sStack_960 + sStack_91c;
  sStack_96e = sStack_95e + sStack_92c;
  sStack_96c = sStack_95c + sStack_91a;
  sStack_96a = sStack_95a + sStack_92a;
  local_6f8 = CONCAT26(sStack_962,CONCAT24(sStack_964,CONCAT22(sStack_966,local_968)));
  uStack_6f0 = CONCAT26(sStack_95a,CONCAT24(sStack_95c,CONCAT22(sStack_95e,sStack_960)));
  local_708 = CONCAT26(sStack_92e,CONCAT24(sStack_91e,CONCAT22(sStack_930,sStack_920)));
  uStack_700 = CONCAT26(sStack_92a,CONCAT24(sStack_91a,CONCAT22(sStack_92c,sStack_91c)));
  local_988 = local_968 - sStack_920;
  sStack_986 = sStack_966 - sStack_930;
  sStack_984 = sStack_964 - sStack_91e;
  sStack_982 = sStack_962 - sStack_92e;
  sStack_980 = sStack_960 - sStack_91c;
  sStack_97e = sStack_95e - sStack_92c;
  sStack_97c = sStack_95c - sStack_91a;
  sStack_97a = sStack_95a - sStack_92a;
  auVar33._8_8_ = uStack_940;
  auVar33._0_8_ = local_948;
  auVar32._8_8_ = 0x4e7b4e7b4e7b4e7b;
  auVar32._0_8_ = 0x8a8c8a8c8a8c8a8c;
  local_998 = pmulhw(auVar33,auVar32);
  uStack_c4 = 0x4e7b4e7b;
  auVar31._8_8_ = uStack_950;
  auVar31._0_8_ = local_958;
  auVar30._8_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar30._0_8_ = 0x4e7b4e7b4e7b4e7b;
  local_9a8 = pmulhw(auVar31,auVar30);
  uVar10 = CONCAT22(sStack_982,sStack_984);
  uStack_19c = CONCAT22(sStack_97a,sStack_97c);
  _local_188 = CONCAT44(uVar14,CONCAT22(sStack_976,local_978));
  _local_198 = CONCAT44(uVar10,CONCAT22(sStack_976,local_978));
  auVar6._4_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar6._0_4_ = uVar10;
  auVar61._0_8_ = auVar6._0_8_ << 0x20;
  auVar61._8_4_ = uStack_1a0;
  auVar61._12_4_ = uStack_19c;
  uStack_9b0 = auVar61._8_8_;
  local_718 = local_998._0_8_;
  uVar13 = local_718;
  uStack_710 = local_998._8_8_;
  uVar16 = uStack_710;
  local_728 = local_9a8._0_8_;
  uVar9 = local_728;
  uStack_720 = local_9a8._8_8_;
  uVar12 = uStack_720;
  local_718._0_2_ = local_998._0_2_;
  local_718._2_2_ = local_998._2_2_;
  local_718._4_2_ = local_998._4_2_;
  local_718._6_2_ = local_998._6_2_;
  uStack_710._0_2_ = local_998._8_2_;
  uStack_710._2_2_ = local_998._10_2_;
  uStack_710._4_2_ = local_998._12_2_;
  uStack_710._6_2_ = local_998._14_2_;
  local_728._0_2_ = local_9a8._0_2_;
  local_728._2_2_ = local_9a8._2_2_;
  local_728._4_2_ = local_9a8._4_2_;
  local_728._6_2_ = local_9a8._6_2_;
  uStack_720._0_2_ = local_9a8._8_2_;
  uStack_720._2_2_ = local_9a8._10_2_;
  uStack_720._4_2_ = local_9a8._12_2_;
  uStack_720._6_2_ = local_9a8._14_2_;
  local_9c8 = (short)local_718 - (short)local_728;
  sStack_9c6 = local_718._2_2_ - local_728._2_2_;
  sStack_9c4 = local_718._4_2_ - local_728._4_2_;
  sStack_9c2 = local_718._6_2_ - local_728._6_2_;
  sStack_9c0 = (short)uStack_710 - (short)uStack_720;
  sStack_9be = uStack_710._2_2_ - uStack_720._2_2_;
  sStack_9bc = uStack_710._4_2_ - uStack_720._4_2_;
  sStack_9ba = uStack_710._6_2_ - uStack_720._6_2_;
  local_4c8 = CONCAT26(sStack_9c2,CONCAT24(sStack_9c4,CONCAT22(sStack_9c6,local_9c8)));
  uStack_4c0 = CONCAT26(sStack_9ba,CONCAT24(sStack_9bc,CONCAT22(sStack_9be,sStack_9c0)));
  local_4b8 = (short)local_9b8;
  sStack_4b6 = (short)((ulong)local_9b8 >> 0x10);
  sStack_4b4 = (short)((ulong)local_9b8 >> 0x20);
  sStack_4b2 = (short)((ulong)local_9b8 >> 0x30);
  uStack_4b0._0_2_ = (short)uStack_1a0;
  uStack_4b0._2_2_ = (short)((uint)uStack_1a0 >> 0x10);
  local_9d8 = local_4b8 + local_9c8;
  sStack_9d6 = sStack_4b6 + sStack_9c6;
  sStack_9d4 = sStack_4b4 + sStack_9c4;
  sStack_9d2 = sStack_4b2 + sStack_9c2;
  sStack_9d0 = (short)uStack_4b0 + sStack_9c0;
  sStack_9ce = uStack_4b0._2_2_ + sStack_9be;
  sStack_9cc = sStack_97c + sStack_9bc;
  sStack_9ca = sStack_97a + sStack_9ba;
  local_4d8 = local_998._0_8_;
  uStack_4d0 = local_998._8_8_;
  local_4e8 = local_9a8._0_8_;
  uStack_4e0 = local_9a8._8_8_;
  local_9e8 = (short)local_718 + (short)local_728;
  sStack_9e6 = local_718._2_2_ + local_728._2_2_;
  sStack_9e4 = local_718._4_2_ + local_728._4_2_;
  sStack_9e2 = local_718._6_2_ + local_728._6_2_;
  sStack_9e0 = (short)uStack_710 + (short)uStack_720;
  sStack_9de = uStack_710._2_2_ + uStack_720._2_2_;
  sStack_9dc = uStack_710._4_2_ + uStack_720._4_2_;
  sStack_9da = uStack_710._6_2_ + uStack_720._6_2_;
  local_4f8 = CONCAT26(sStack_972,CONCAT24(sStack_974,CONCAT22(sStack_976,local_978)));
  uStack_4f0 = CONCAT26(sStack_96a,CONCAT24(sStack_96c,CONCAT22(sStack_96e,sStack_970)));
  local_508 = CONCAT26(sStack_9e2,CONCAT24(sStack_9e4,CONCAT22(sStack_9e6,local_9e8)));
  uStack_500 = CONCAT26(sStack_9da,CONCAT24(sStack_9dc,CONCAT22(sStack_9de,sStack_9e0)));
  local_9f8 = local_978 + local_9e8;
  sStack_9f6 = sStack_976 + sStack_9e6;
  sStack_9f4 = sStack_974 + sStack_9e4;
  sStack_9f2 = sStack_972 + sStack_9e2;
  sStack_9f0 = sStack_970 + sStack_9e0;
  sStack_9ee = sStack_96e + sStack_9de;
  uStack_9ec = CONCAT22(sStack_96a + sStack_9da,sStack_96c + sStack_9dc);
  local_1c8 = CONCAT26(sStack_9f2,CONCAT24(sStack_9f4,CONCAT22(sStack_9f6,local_9f8)));
  uStack_1ac = uStack_9ec;
  _local_1a8 = CONCAT44(uVar10,CONCAT22(sStack_9e6,local_9e8));
  uStack_1bc = uStack_9ec;
  uStack_1b4 = (undefined4)((ulong)local_1c8 >> 0x20);
  _local_1b8 = CONCAT44(uStack_1b4,CONCAT22(sStack_9e6,local_9e8));
  auVar7._4_8_ = uStack_500;
  auVar7._0_4_ = uStack_1b4;
  auVar62._0_8_ = auVar7._0_8_ << 0x20;
  auVar62._8_4_ = uStack_1c0;
  auVar62._12_4_ = uStack_9ec;
  uStack_a00 = auVar62._8_8_;
  local_a18 = CONCAT26(sStack_972,CONCAT24(sStack_974,CONCAT22(sStack_976,local_978)));
  uStack_390 = CONCAT26(sStack_96a,CONCAT24(sStack_96c,CONCAT22(sStack_96e,sStack_970)));
  uStack_a10 = CONCAT26(sStack_982,CONCAT24(sStack_984,CONCAT22(sStack_986,local_988)));
  uStack_3a0 = CONCAT26(sStack_97a,CONCAT24(sStack_97c,CONCAT22(sStack_97e,sStack_980)));
  uStack_a20 = CONCAT26(sStack_9d2,CONCAT24(sStack_9d4,CONCAT22(sStack_9d6,local_9d8)));
  uStack_3c0 = CONCAT26(sStack_9ca,CONCAT24(sStack_9cc,CONCAT22(sStack_9ce,sStack_9d0)));
  local_528 = (short)local_a08;
  sStack_526 = (short)((ulong)local_a08 >> 0x10);
  sStack_524 = (short)((ulong)local_a08 >> 0x20);
  sStack_522 = (short)((ulong)local_a08 >> 0x30);
  local_a38 = local_978 + local_528;
  sStack_a36 = sStack_976 + sStack_526;
  sStack_a34 = sStack_974 + sStack_524;
  sStack_a32 = sStack_972 + sStack_522;
  sStack_a30 = local_988 + local_9d8;
  sStack_a2e = sStack_986 + sStack_9d6;
  sStack_a2c = sStack_984 + sStack_9d4;
  sStack_a2a = sStack_982 + sStack_9d2;
  local_a48 = local_978 - local_528;
  sStack_a46 = sStack_976 - sStack_526;
  sStack_a44 = sStack_974 - sStack_524;
  sStack_a42 = sStack_972 - sStack_522;
  sStack_a40 = local_988 - local_9d8;
  sStack_a3e = sStack_986 - sStack_9d6;
  sStack_a3c = sStack_984 - sStack_9d4;
  sStack_a3a = sStack_982 - sStack_9d2;
  uVar8 = CONCAT26(sStack_a42,CONCAT24(sStack_a44,CONCAT22(sStack_a46,local_a48)));
  auVar26._8_2_ = sStack_a40;
  auVar26._0_8_ = uVar8;
  auVar26._10_2_ = sStack_a3e;
  auVar26._12_2_ = sStack_a3c;
  auVar26._14_2_ = sStack_a3a;
  local_a58._0_8_ = auVar26._8_8_;
  local_a58._8_4_ = CONCAT22(sStack_a46,local_a48);
  local_a58._12_4_ = (int)((ulong)uVar8 >> 0x20);
  local_658 = CONCAT26(sStack_a32,CONCAT24(sStack_a34,CONCAT22(sStack_a36,local_a38)));
  uStack_650 = CONCAT26(sStack_a2a,CONCAT24(sStack_a2c,CONCAT22(sStack_a2e,sStack_a30)));
  local_65c = 3;
  auVar29._8_8_ = uStack_650;
  auVar29._0_8_ = local_658;
  local_a68 = psraw(auVar29,ZEXT416(3));
  uStack_670 = local_a58._8_8_;
  local_67c = 3;
  auVar28._8_8_ = local_a58._8_8_;
  auVar28._0_8_ = local_a58._0_8_;
  local_a78 = psraw(auVar28,ZEXT416(3));
  local_298 = local_a68._0_8_;
  uVar38 = local_298;
  uStack_290 = local_a68._8_8_;
  local_2a8 = local_a78._0_8_;
  uVar8 = local_2a8;
  uStack_2a0 = local_a78._8_8_;
  local_298._0_2_ = local_a68._0_2_;
  local_298._2_2_ = local_a68._2_2_;
  local_298._4_2_ = local_a68._4_2_;
  local_298._6_2_ = local_a68._6_2_;
  local_2a8._0_2_ = local_a78._0_2_;
  local_2a8._2_2_ = local_a78._2_2_;
  local_2a8._4_2_ = local_a78._4_2_;
  local_2a8._6_2_ = local_a78._6_2_;
  local_a88 = (short)local_298;
  sStack_a86 = (short)local_2a8;
  sStack_a84 = local_298._2_2_;
  sStack_a82 = local_2a8._2_2_;
  sStack_a80 = local_298._4_2_;
  sStack_a7e = local_2a8._4_2_;
  sStack_a7c = local_298._6_2_;
  sStack_a7a = local_2a8._6_2_;
  local_218 = local_a68._0_8_;
  uStack_210 = local_a68._8_8_;
  uVar40 = uStack_210;
  local_228 = local_a78._0_8_;
  uStack_220 = local_a78._8_8_;
  uVar39 = uStack_220;
  uStack_210._0_2_ = local_a68._8_2_;
  uStack_210._2_2_ = local_a68._10_2_;
  uStack_210._4_2_ = local_a68._12_2_;
  uStack_210._6_2_ = local_a68._14_2_;
  uStack_220._0_2_ = local_a78._8_2_;
  uStack_220._2_2_ = local_a78._10_2_;
  uStack_220._4_2_ = local_a78._12_2_;
  uStack_220._6_2_ = local_a78._14_2_;
  local_a98 = (short)uStack_210;
  sStack_a96 = (short)uStack_220;
  sStack_a94 = uStack_210._2_2_;
  sStack_a92 = uStack_220._2_2_;
  sStack_a90 = uStack_210._4_2_;
  sStack_a8e = uStack_220._4_2_;
  sStack_a8c = uStack_210._6_2_;
  sStack_a8a = uStack_220._6_2_;
  local_2b8 = CONCAT26(local_2a8._2_2_,
                       CONCAT24(local_298._2_2_,CONCAT22((short)local_2a8,(short)local_298)));
  uStack_2b0 = CONCAT26(local_2a8._6_2_,
                        CONCAT24(local_298._6_2_,CONCAT22(local_2a8._4_2_,local_298._4_2_)));
  local_2c8 = CONCAT26(uStack_220._2_2_,
                       CONCAT24(uStack_210._2_2_,CONCAT22((short)uStack_220,(short)uStack_210)));
  uStack_2c0 = CONCAT26(uStack_220._6_2_,
                        CONCAT24(uStack_210._6_2_,CONCAT22(uStack_220._4_2_,uStack_210._4_2_)));
  local_7d8 = (short)local_298;
  sStack_7d6 = (short)uStack_210;
  sStack_7d4 = (short)local_2a8;
  sStack_7d2 = (short)uStack_220;
  sStack_7d0 = local_298._2_2_;
  sStack_7ce = uStack_210._2_2_;
  sStack_7cc = local_2a8._2_2_;
  sStack_7ca = uStack_220._2_2_;
  local_238 = CONCAT26(local_2a8._2_2_,
                       CONCAT24(local_298._2_2_,CONCAT22((short)local_2a8,(short)local_298)));
  uStack_230 = CONCAT26(local_2a8._6_2_,
                        CONCAT24(local_298._6_2_,CONCAT22(local_2a8._4_2_,local_298._4_2_)));
  local_248 = CONCAT26(uStack_220._2_2_,
                       CONCAT24(uStack_210._2_2_,CONCAT22((short)uStack_220,(short)uStack_210)));
  uStack_240 = CONCAT26(uStack_220._6_2_,
                        CONCAT24(uStack_210._6_2_,CONCAT22(uStack_220._4_2_,uStack_210._4_2_)));
  local_7e8 = local_298._4_2_;
  sStack_7e6 = uStack_210._4_2_;
  sStack_7e4 = local_2a8._4_2_;
  sStack_7e2 = uStack_220._4_2_;
  sStack_7e0 = local_298._6_2_;
  sStack_7de = uStack_210._6_2_;
  sStack_7dc = local_2a8._6_2_;
  sStack_7da = uStack_220._6_2_;
  sStack_934 = sStack_95e;
  sStack_932 = sStack_95a;
  sStack_924 = sStack_960;
  sStack_922 = sStack_95c;
  local_908 = sStack_936;
  sStack_906 = sStack_95a;
  sStack_904 = sStack_92e;
  sStack_902 = sStack_92a;
  sStack_900 = sStack_926;
  sStack_8fe = sStack_95c;
  sStack_8fc = sStack_91e;
  sStack_8fa = sStack_91a;
  local_8f8 = local_928;
  sStack_8f6 = sStack_960;
  sStack_8f4 = sStack_920;
  sStack_8f2 = sStack_91c;
  sStack_8f0 = local_938;
  sStack_8ee = sStack_95e;
  sStack_8ec = sStack_930;
  sStack_8ea = sStack_92c;
  uStack_800 = uStack_6a0;
  uStack_7f0 = uStack_690;
  uStack_740 = uStack_a20;
  local_738 = local_a18;
  uStack_730 = uStack_a10;
  local_728 = uVar9;
  uStack_720 = uVar12;
  local_718 = uVar13;
  uStack_710 = uVar16;
  uStack_6e0 = uStack_8e0;
  local_6d8 = local_8d8;
  uStack_6d0 = uStack_8d0;
  local_6c8 = uVar17;
  uStack_6c0 = uVar18;
  local_6b8 = uVar19;
  uStack_6b0 = uVar22;
  local_698 = local_7f8;
  local_678 = local_a58._0_8_;
  local_628 = local_7c8;
  uStack_620 = uStack_7c0;
  local_608 = local_7a8;
  uStack_600 = uStack_7a0;
  local_5e8 = local_798;
  uStack_5e0 = uStack_790;
  uStack_520 = uStack_a20;
  local_518 = local_a18;
  uStack_510 = uStack_a10;
  uStack_4b0 = uStack_9b0;
  local_488 = local_7c8;
  uStack_480 = uStack_7c0;
  uStack_460 = uStack_8e0;
  local_458 = local_8d8;
  uStack_450 = uStack_8d0;
  uStack_3f0 = uStack_870;
  local_3e8 = uVar23;
  uStack_3e0 = uStack_6a0;
  local_3d8 = local_7f8;
  uStack_3d0 = uStack_690;
  local_3c8 = uStack_a20;
  uStack_3b0 = uStack_a00;
  local_3a8 = uStack_a10;
  local_398 = local_a18;
  local_388 = uStack_8e0;
  uStack_370 = uStack_8c0;
  local_368 = uStack_8d0;
  local_358 = local_8d8;
  local_2a8 = uVar8;
  local_298 = uVar38;
  local_268 = local_918._0_8_;
  uStack_220 = uVar39;
  uStack_210 = uVar40;
  local_1e8 = local_918._0_8_;
  uStack_18c = uStack_19c;
  uStack_16c = uStack_17c;
  uStack_14c = uStack_15c;
  uStack_10c = uStack_11c;
  local_e8 = local_7f8;
  uStack_c0 = uStack_790;
  uStack_b0 = uStack_950;
  local_a8 = local_7a8;
  uStack_a0 = uStack_7a0;
  uStack_90 = uStack_940;
  local_88 = local_798;
  uStack_80 = uStack_790;
  local_68 = local_7a8;
  uStack_60 = uStack_7a0;
  uVar41 = WebPMemToInt32((uint8_t *)0x19bd53);
  local_2e8._4_4_ = 0;
  local_2e8._0_4_ = uVar41;
  uVar12 = local_2e8._0_8_;
  local_2e8 = ZEXT416(uVar41);
  local_2cc = uVar41;
  uVar42 = WebPMemToInt32((uint8_t *)0x19bd89);
  local_308._4_4_ = 0;
  local_308._0_4_ = uVar42;
  uVar9 = local_308._0_8_;
  local_308 = ZEXT416(uVar42);
  local_2ec = uVar42;
  uVar43 = WebPMemToInt32((uint8_t *)0x19bdbf);
  local_328._4_4_ = 0;
  local_328._0_4_ = uVar43;
  uVar8 = local_328._0_8_;
  local_328 = ZEXT416(uVar43);
  local_30c = uVar43;
  local_32c = WebPMemToInt32((uint8_t *)0x19bdf5);
  local_348._4_4_ = 0;
  local_348._0_4_ = local_32c;
  local_348._8_8_ = (uint8_t *)0x0;
  local_18 = uVar12;
  uStack_10 = 0;
  local_28 = uVar9;
  uStack_20 = 0;
  uStack_aa4._0_1_ = (char)uVar42;
  uStack_aa4._1_1_ = (undefined1)(uVar42 >> 8);
  uStack_aa2._0_1_ = (char)(uVar42 >> 0x10);
  uStack_aa2._1_1_ = (undefined1)(uVar42 >> 0x18);
  local_38 = uVar8;
  uStack_30 = 0;
  local_48 = local_348._0_8_;
  uStack_40 = 0;
  uStack_ab4._0_1_ = (char)local_32c;
  uStack_ab4._1_1_ = (undefined1)(local_32c >> 8);
  uStack_ab2._0_1_ = (char)(local_32c >> 0x10);
  uStack_ab2._1_1_ = (undefined1)(local_32c >> 0x18);
  uVar17 = CONCAT17(uStack_aa2._1_1_,
                    CONCAT16((char)uStack_aa2,
                             CONCAT15(uStack_aa4._1_1_,CONCAT14((char)uStack_aa4,uVar41))));
  uStack_590 = 0;
  local_5a8 = local_7b8;
  uVar38 = local_5a8;
  uStack_5a0 = uStack_7b0;
  local_598._0_1_ = (undefined1)uVar41;
  local_598._1_1_ = (undefined1)(uVar41 >> 8);
  local_598._2_1_ = (undefined1)(uVar41 >> 0x10);
  local_598._3_1_ = (undefined1)(uVar41 >> 0x18);
  local_5a8._0_1_ = (undefined1)local_7b8;
  local_5a8._1_1_ = (undefined1)((ulong)local_7b8 >> 8);
  local_5a8._2_1_ = (undefined1)((ulong)local_7b8 >> 0x10);
  local_5a8._3_1_ = (undefined1)((ulong)local_7b8 >> 0x18);
  local_5a8._4_1_ = (undefined1)((ulong)local_7b8 >> 0x20);
  local_5a8._5_1_ = (undefined1)((ulong)local_7b8 >> 0x28);
  local_5a8._6_1_ = (undefined1)((ulong)local_7b8 >> 0x30);
  local_5a8._7_1_ = (undefined1)((ulong)local_7b8 >> 0x38);
  uVar8 = CONCAT17(uStack_ab2._1_1_,
                   CONCAT16((char)uStack_ab2,
                            CONCAT15(uStack_ab4._1_1_,CONCAT14((char)uStack_ab4,uVar43))));
  uStack_5b0 = 0;
  local_5c8 = local_7b8;
  uStack_5c0 = uStack_7b0;
  local_5b8._0_1_ = (undefined1)uVar43;
  local_5b8._1_1_ = (undefined1)(uVar43 >> 8);
  local_5b8._2_1_ = (undefined1)(uVar43 >> 0x10);
  local_5b8._3_1_ = (undefined1)(uVar43 >> 0x18);
  uVar10 = CONCAT13(local_5a8._1_1_,
                    CONCAT12(local_598._1_1_,CONCAT11((undefined1)local_5a8,(undefined1)local_598)))
  ;
  uVar11 = CONCAT15(local_5a8._2_1_,CONCAT14(local_598._2_1_,uVar10));
  uVar18 = CONCAT17(local_5a8._3_1_,CONCAT16(local_598._3_1_,uVar11));
  uVar14 = CONCAT13(local_5a8._5_1_,
                    CONCAT12(uStack_aa4._1_1_,CONCAT11(local_5a8._4_1_,(char)uStack_aa4)));
  uVar15 = CONCAT15(local_5a8._6_1_,CONCAT14((char)uStack_aa2,uVar14));
  uVar22 = CONCAT17(local_5a8._7_1_,CONCAT16(uStack_aa2._1_1_,uVar15));
  local_548 = CONCAT26(sStack_7d2,CONCAT24(sStack_7d4,CONCAT22(sStack_7d6,local_7d8)));
  uStack_540 = CONCAT26(sStack_7ca,CONCAT24(sStack_7cc,CONCAT22(sStack_7ce,sStack_7d0)));
  local_538._2_2_ = (short)((uint)uVar10 >> 0x10);
  local_538._4_2_ = (short)((uint6)uVar11 >> 0x20);
  local_538._6_2_ = (short)((ulong)uVar18 >> 0x30);
  uStack_530._2_2_ = (short)((uint)uVar14 >> 0x10);
  uStack_530._4_2_ = (short)((uint6)uVar15 >> 0x20);
  uStack_530._6_2_ = (short)((ulong)uVar22 >> 0x30);
  local_aa8 = CONCAT11((undefined1)local_5a8,(undefined1)local_598) + local_7d8;
  sVar44 = local_538._2_2_ + sStack_7d6;
  sVar46 = local_538._4_2_ + sStack_7d4;
  sVar48 = local_538._6_2_ + sStack_7d2;
  sStack_aa0 = CONCAT11(local_5a8._4_1_,(char)uStack_aa4) + sStack_7d0;
  sVar50 = uStack_530._2_2_ + sStack_7ce;
  sVar52 = uStack_530._4_2_ + sStack_7cc;
  sVar54 = uStack_530._6_2_ + sStack_7ca;
  uStack_aa6._0_1_ = (char)sVar44;
  uStack_aa6._1_1_ = (undefined1)((ushort)sVar44 >> 8);
  uStack_aa4._0_1_ = (char)sVar46;
  uStack_aa4._1_1_ = (undefined1)((ushort)sVar46 >> 8);
  uStack_aa2._0_1_ = (char)sVar48;
  uStack_aa2._1_1_ = (undefined1)((ushort)sVar48 >> 8);
  uStack_a9e._0_1_ = (char)sVar50;
  uStack_a9e._1_1_ = (undefined1)((ushort)sVar50 >> 8);
  uStack_a9c._0_1_ = (char)sVar52;
  uStack_a9c._1_1_ = (undefined1)((ushort)sVar52 >> 8);
  uStack_a9a._0_1_ = (char)sVar54;
  uStack_a9a._1_1_ = (undefined1)((ushort)sVar54 >> 8);
  uVar10 = CONCAT13(local_5a8._1_1_,
                    CONCAT12(local_5b8._1_1_,CONCAT11((undefined1)local_5a8,(undefined1)local_5b8)))
  ;
  uVar11 = CONCAT15(local_5a8._2_1_,CONCAT14(local_5b8._2_1_,uVar10));
  uVar9 = CONCAT17(local_5a8._3_1_,CONCAT16(local_5b8._3_1_,uVar11));
  uVar14 = CONCAT13(local_5a8._5_1_,
                    CONCAT12(uStack_ab4._1_1_,CONCAT11(local_5a8._4_1_,(char)uStack_ab4)));
  uVar15 = CONCAT15(local_5a8._6_1_,CONCAT14((char)uStack_ab2,uVar14));
  uVar13 = CONCAT17(local_5a8._7_1_,CONCAT16(uStack_ab2._1_1_,uVar15));
  local_568 = CONCAT26(sStack_7e2,CONCAT24(sStack_7e4,CONCAT22(sStack_7e6,local_7e8)));
  uStack_560 = CONCAT26(sStack_7da,CONCAT24(sStack_7dc,CONCAT22(sStack_7de,sStack_7e0)));
  local_558._2_2_ = (short)((uint)uVar10 >> 0x10);
  local_558._4_2_ = (short)((uint6)uVar11 >> 0x20);
  local_558._6_2_ = (short)((ulong)uVar9 >> 0x30);
  uStack_550._2_2_ = (short)((uint)uVar14 >> 0x10);
  uStack_550._4_2_ = (short)((uint6)uVar15 >> 0x20);
  uStack_550._6_2_ = (short)((ulong)uVar13 >> 0x30);
  local_ab8 = CONCAT11((undefined1)local_5a8,(undefined1)local_5b8) + local_7e8;
  sVar45 = local_558._2_2_ + sStack_7e6;
  sVar47 = local_558._4_2_ + sStack_7e4;
  sVar49 = local_558._6_2_ + sStack_7e2;
  sStack_ab0 = CONCAT11(local_5a8._4_1_,(char)uStack_ab4) + sStack_7e0;
  sVar51 = uStack_550._2_2_ + sStack_7de;
  sVar53 = uStack_550._4_2_ + sStack_7dc;
  sVar55 = uStack_550._6_2_ + sStack_7da;
  uStack_ab6._0_1_ = (char)sVar45;
  uStack_ab6._1_1_ = (undefined1)((ushort)sVar45 >> 8);
  uStack_ab4._0_1_ = (char)sVar47;
  uStack_ab4._1_1_ = (undefined1)((ushort)sVar47 >> 8);
  uStack_ab2._0_1_ = (char)sVar49;
  uStack_ab2._1_1_ = (undefined1)((ushort)sVar49 >> 8);
  uStack_aae._0_1_ = (char)sVar51;
  uStack_aae._1_1_ = (undefined1)((ushort)sVar51 >> 8);
  uStack_aac._0_1_ = (char)sVar53;
  uStack_aac._1_1_ = (undefined1)((ushort)sVar53 >> 8);
  uStack_aaa._0_1_ = (char)sVar55;
  uStack_aaa._1_1_ = (undefined1)((ushort)sVar55 >> 8);
  uVar20 = CONCAT13(uStack_aa6._1_1_,CONCAT12((char)uStack_aa6,local_aa8));
  uVar21 = CONCAT15(uStack_aa4._1_1_,CONCAT14((char)uStack_aa4,uVar20));
  uVar19 = CONCAT17(uStack_aa2._1_1_,CONCAT16((char)uStack_aa2,uVar21));
  uVar24 = CONCAT13(uStack_a9e._1_1_,CONCAT12((char)uStack_a9e,sStack_aa0));
  uVar25 = CONCAT15(uStack_a9c._1_1_,CONCAT14((char)uStack_a9c,uVar24));
  uVar23 = CONCAT17(uStack_a9a._1_1_,CONCAT16((char)uStack_a9a,uVar25));
  uVar10 = CONCAT13(uStack_ab6._1_1_,CONCAT12((char)uStack_ab6,local_ab8));
  uVar11 = CONCAT15(uStack_ab4._1_1_,CONCAT14((char)uStack_ab4,uVar10));
  uVar12 = CONCAT17(uStack_ab2._1_1_,CONCAT16((char)uStack_ab2,uVar11));
  uVar14 = CONCAT13(uStack_aae._1_1_,CONCAT12((char)uStack_aae,sStack_ab0));
  uVar15 = CONCAT15(uStack_aac._1_1_,CONCAT14((char)uStack_aac,uVar14));
  uVar16 = CONCAT17(uStack_aaa._1_1_,CONCAT16((char)uStack_aaa,uVar15));
  local_578._2_2_ = (short)((uint)uVar20 >> 0x10);
  local_578._4_2_ = (short)((uint6)uVar21 >> 0x20);
  local_578._6_2_ = (short)((ulong)uVar19 >> 0x30);
  uStack_570._2_2_ = (short)((uint)uVar24 >> 0x10);
  uStack_570._4_2_ = (short)((uint6)uVar25 >> 0x20);
  uStack_570._6_2_ = (short)((ulong)uVar23 >> 0x30);
  local_588._2_2_ = (short)((uint)uVar10 >> 0x10);
  local_588._4_2_ = (short)((uint6)uVar11 >> 0x20);
  local_588._6_2_ = (short)((ulong)uVar12 >> 0x30);
  uStack_580._2_2_ = (short)((uint)uVar14 >> 0x10);
  uStack_580._4_2_ = (short)((uint6)uVar15 >> 0x20);
  uStack_580._6_2_ = (short)((ulong)uVar16 >> 0x30);
  local_ac8 = (0 < local_aa8) * (local_aa8 < 0x100) * (char)local_aa8 - (0xff < local_aa8);
  cStack_ac7 = (0 < local_578._2_2_) * (local_578._2_2_ < 0x100) * (char)uStack_aa6 -
               (0xff < local_578._2_2_);
  cStack_ac6 = (0 < local_578._4_2_) * (local_578._4_2_ < 0x100) * (char)uStack_aa4 -
               (0xff < local_578._4_2_);
  cStack_ac5 = (0 < local_578._6_2_) * (local_578._6_2_ < 0x100) * (char)uStack_aa2 -
               (0xff < local_578._6_2_);
  cStack_ac4 = (0 < sStack_aa0) * (sStack_aa0 < 0x100) * (char)sStack_aa0 - (0xff < sStack_aa0);
  cStack_ac3 = (0 < uStack_570._2_2_) * (uStack_570._2_2_ < 0x100) * (char)uStack_a9e -
               (0xff < uStack_570._2_2_);
  cStack_ac2 = (0 < uStack_570._4_2_) * (uStack_570._4_2_ < 0x100) * (char)uStack_a9c -
               (0xff < uStack_570._4_2_);
  cStack_ac1 = (0 < uStack_570._6_2_) * (uStack_570._6_2_ < 0x100) * (char)uStack_a9a -
               (0xff < uStack_570._6_2_);
  cStack_ac0 = (0 < local_ab8) * (local_ab8 < 0x100) * (char)local_ab8 - (0xff < local_ab8);
  cStack_abf = (0 < local_588._2_2_) * (local_588._2_2_ < 0x100) * (char)uStack_ab6 -
               (0xff < local_588._2_2_);
  cStack_abe = (0 < local_588._4_2_) * (local_588._4_2_ < 0x100) * (char)uStack_ab4 -
               (0xff < local_588._4_2_);
  cStack_abd = (0 < local_588._6_2_) * (local_588._6_2_ < 0x100) * (char)uStack_ab2 -
               (0xff < local_588._6_2_);
  cStack_abc = (0 < sStack_ab0) * (sStack_ab0 < 0x100) * (char)sStack_ab0 - (0xff < sStack_ab0);
  cStack_abb = (0 < uStack_580._2_2_) * (uStack_580._2_2_ < 0x100) * (char)uStack_aae -
               (0xff < uStack_580._2_2_);
  cStack_aba = (0 < uStack_580._4_2_) * (uStack_580._4_2_ < 0x100) * (char)uStack_aac -
               (0xff < uStack_580._4_2_);
  cStack_ab9 = (0 < uStack_580._6_2_) * (uStack_580._6_2_ < 0x100) * (char)uStack_aaa -
               (0xff < uStack_580._6_2_);
  local_630 = &local_ad8;
  local_648 = CONCAT17(cStack_ac1,
                       CONCAT16(cStack_ac2,
                                CONCAT15(cStack_ac3,
                                         CONCAT14(cStack_ac4,
                                                  CONCAT13(cStack_ac5,
                                                           CONCAT12(cStack_ac6,
                                                                    CONCAT11(cStack_ac7,local_ac8)))
                                                 ))));
  uStack_640 = CONCAT17(cStack_ab9,
                        CONCAT16(cStack_aba,
                                 CONCAT15(cStack_abb,
                                          CONCAT14(cStack_abc,
                                                   CONCAT13(cStack_abd,
                                                            CONCAT12(cStack_abe,
                                                                     CONCAT11(cStack_abf,cStack_ac0)
                                                                    ))))));
  uVar63 = local_348._0_8_;
  ptr = (uint8_t *)local_348._8_8_;
  local_5b8 = uVar8;
  local_5a8 = uVar38;
  local_598 = uVar17;
  local_588 = uVar12;
  uStack_580 = uVar16;
  local_578 = uVar19;
  uStack_570 = uVar23;
  local_558 = uVar9;
  uStack_550 = uVar13;
  local_538 = uVar18;
  uStack_530 = uVar22;
  local_348._0_16_ = ZEXT416(local_32c);
  uStack_ab6 = sVar45;
  uStack_ab4 = sVar47;
  uStack_ab2 = sVar49;
  uStack_aae = sVar51;
  uStack_aac = sVar53;
  uStack_aaa = sVar55;
  uStack_aa6 = sVar44;
  uStack_aa4 = sVar46;
  uStack_aa2 = sVar48;
  uStack_a9e = sVar50;
  uStack_a9c = sVar52;
  uStack_a9a = sVar54;
  local_ad8 = local_648;
  uStack_ad0 = uStack_640;
  WebPInt32ToMem((uint8_t *)0x0,0);
  val = (int)(uVar63 >> 0x20);
  WebPInt32ToMem(ptr,val);
  WebPInt32ToMem(ptr,val);
  WebPInt32ToMem(ptr,val);
  return;
}

Assistant:

static void ITransform_One_SSE2(const uint8_t* WEBP_RESTRICT ref,
                                const int16_t* WEBP_RESTRICT in,
                                uint8_t* WEBP_RESTRICT dst) {
  // This implementation makes use of 16-bit fixed point versions of two
  // multiply constants:
  //    K1 = sqrt(2) * cos (pi/8) ~= 85627 / 2^16
  //    K2 = sqrt(2) * sin (pi/8) ~= 35468 / 2^16
  //
  // To be able to use signed 16-bit integers, we use the following trick to
  // have constants within range:
  // - Associated constants are obtained by subtracting the 16-bit fixed point
  //   version of one:
  //      k = K - (1 << 16)  =>  K = k + (1 << 16)
  //      K1 = 85267  =>  k1 =  20091
  //      K2 = 35468  =>  k2 = -30068
  // - The multiplication of a variable by a constant become the sum of the
  //   variable and the multiplication of that variable by the associated
  //   constant:
  //      (x * K) >> 16 = (x * (k + (1 << 16))) >> 16 = ((x * k ) >> 16) + x
  const __m128i k1k2 = _mm_set_epi16(-30068, -30068, -30068, -30068,
                                     20091, 20091, 20091, 20091);
  const __m128i k2k1 = _mm_set_epi16(20091, 20091, 20091, 20091,
                                     -30068, -30068, -30068, -30068);
  const __m128i zero = _mm_setzero_si128();
  const __m128i zero_four = _mm_set_epi16(0, 0, 0, 0, 4, 4, 4, 4);
  __m128i T01, T23;

  // Load and concatenate the transform coefficients.
  const __m128i in01 = _mm_loadu_si128((const __m128i*)&in[0]);
  const __m128i in23 = _mm_loadu_si128((const __m128i*)&in[8]);
  // a00 a10 a20 a30   a01 a11 a21 a31
  // a02 a12 a22 a32   a03 a13 a23 a33

  // Vertical pass and subsequent transpose.
  {
    const __m128i in1 = _mm_unpackhi_epi64(in01, in01);
    const __m128i in3 = _mm_unpackhi_epi64(in23, in23);

    // First pass, c and d calculations are longer because of the "trick"
    // multiplications.
    // c = MUL(in1, K2) - MUL(in3, K1) = MUL(in1, k2) - MUL(in3, k1) + in1 - in3
    // d = MUL(in1, K1) + MUL(in3, K2) = MUL(in1, k1) + MUL(in3, k2) + in1 + in3
    const __m128i a_d3 = _mm_add_epi16(in01, in23);
    const __m128i b_c3 = _mm_sub_epi16(in01, in23);
    const __m128i c1d1 = _mm_mulhi_epi16(in1, k2k1);
    const __m128i c2d2 = _mm_mulhi_epi16(in3, k1k2);
    const __m128i c3 = _mm_unpackhi_epi64(b_c3, b_c3);
    const __m128i c4 = _mm_sub_epi16(c1d1, c2d2);
    const __m128i c = _mm_add_epi16(c3, c4);
    const __m128i d4u = _mm_add_epi16(c1d1, c2d2);
    const __m128i du = _mm_add_epi16(a_d3, d4u);
    const __m128i d = _mm_unpackhi_epi64(du, du);

    // Second pass.
    const __m128i comb_ab = _mm_unpacklo_epi64(a_d3, b_c3);
    const __m128i comb_dc = _mm_unpacklo_epi64(d, c);

    const __m128i tmp01 = _mm_add_epi16(comb_ab, comb_dc);
    const __m128i tmp32 = _mm_sub_epi16(comb_ab, comb_dc);
    const __m128i tmp23 = _mm_shuffle_epi32(tmp32, _MM_SHUFFLE(1, 0, 3, 2));

    const __m128i transpose_0 = _mm_unpacklo_epi16(tmp01, tmp23);
    const __m128i transpose_1 = _mm_unpackhi_epi16(tmp01, tmp23);
    // a00 a20 a01 a21   a02 a22 a03 a23
    // a10 a30 a11 a31   a12 a32 a13 a33

    T01 = _mm_unpacklo_epi16(transpose_0, transpose_1);
    T23 = _mm_unpackhi_epi16(transpose_0, transpose_1);
    // a00 a10 a20 a30   a01 a11 a21 a31
    // a02 a12 a22 a32   a03 a13 a23 a33
  }

  // Horizontal pass and subsequent transpose.
  {
    const __m128i T1 = _mm_unpackhi_epi64(T01, T01);
    const __m128i T3 = _mm_unpackhi_epi64(T23, T23);

    // First pass, c and d calculations are longer because of the "trick"
    // multiplications.
    const __m128i dc = _mm_add_epi16(T01, zero_four);

    // c = MUL(T1, K2) - MUL(T3, K1) = MUL(T1, k2) - MUL(T3, k1) + T1 - T3
    // d = MUL(T1, K1) + MUL(T3, K2) = MUL(T1, k1) + MUL(T3, k2) + T1 + T3
    const __m128i a_d3 = _mm_add_epi16(dc, T23);
    const __m128i b_c3 = _mm_sub_epi16(dc, T23);
    const __m128i c1d1 = _mm_mulhi_epi16(T1, k2k1);
    const __m128i c2d2 = _mm_mulhi_epi16(T3, k1k2);
    const __m128i c3 = _mm_unpackhi_epi64(b_c3, b_c3);
    const __m128i c4 = _mm_sub_epi16(c1d1, c2d2);
    const __m128i c = _mm_add_epi16(c3, c4);
    const __m128i d4u = _mm_add_epi16(c1d1, c2d2);
    const __m128i du = _mm_add_epi16(a_d3, d4u);
    const __m128i d = _mm_unpackhi_epi64(du, du);

    // Second pass.
    const __m128i comb_ab = _mm_unpacklo_epi64(a_d3, b_c3);
    const __m128i comb_dc = _mm_unpacklo_epi64(d, c);

    const __m128i tmp01 = _mm_add_epi16(comb_ab, comb_dc);
    const __m128i tmp32 = _mm_sub_epi16(comb_ab, comb_dc);
    const __m128i tmp23 = _mm_shuffle_epi32(tmp32, _MM_SHUFFLE(1, 0, 3, 2));

    const __m128i shifted01 = _mm_srai_epi16(tmp01, 3);
    const __m128i shifted23 = _mm_srai_epi16(tmp23, 3);
    // a00 a01 a02 a03   a10 a11 a12 a13
    // a20 a21 a22 a23   a30 a31 a32 a33

    const __m128i transpose_0 = _mm_unpacklo_epi16(shifted01, shifted23);
    const __m128i transpose_1 = _mm_unpackhi_epi16(shifted01, shifted23);
    // a00 a20 a01 a21   a02 a22 a03 a23
    // a10 a30 a11 a31   a12 a32 a13 a33

    T01 = _mm_unpacklo_epi16(transpose_0, transpose_1);
    T23 = _mm_unpackhi_epi16(transpose_0, transpose_1);
    // a00 a10 a20 a30   a01 a11 a21 a31
    // a02 a12 a22 a32   a03 a13 a23 a33
  }

  // Add inverse transform to 'ref' and store.
  {
    // Load the reference(s).
    __m128i ref01, ref23, ref0123;
    int32_t buf[4];

    // Load four bytes/pixels per line.
    const __m128i ref0 = _mm_cvtsi32_si128(WebPMemToInt32(&ref[0 * BPS]));
    const __m128i ref1 = _mm_cvtsi32_si128(WebPMemToInt32(&ref[1 * BPS]));
    const __m128i ref2 = _mm_cvtsi32_si128(WebPMemToInt32(&ref[2 * BPS]));
    const __m128i ref3 = _mm_cvtsi32_si128(WebPMemToInt32(&ref[3 * BPS]));
    ref01 = _mm_unpacklo_epi32(ref0, ref1);
    ref23 = _mm_unpacklo_epi32(ref2, ref3);

    // Convert to 16b.
    ref01 = _mm_unpacklo_epi8(ref01, zero);
    ref23 = _mm_unpacklo_epi8(ref23, zero);
    // Add the inverse transform(s).
    ref01 = _mm_add_epi16(ref01, T01);
    ref23 = _mm_add_epi16(ref23, T23);
    // Unsigned saturate to 8b.
    ref0123 = _mm_packus_epi16(ref01, ref23);

    _mm_storeu_si128((__m128i *)buf, ref0123);

    // Store four bytes/pixels per line.
    WebPInt32ToMem(&dst[0 * BPS], buf[0]);
    WebPInt32ToMem(&dst[1 * BPS], buf[1]);
    WebPInt32ToMem(&dst[2 * BPS], buf[2]);
    WebPInt32ToMem(&dst[3 * BPS], buf[3]);
  }
}